

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86regalloc.cpp
# Opt level: O1

Error asmjit::X86RAPass_translateOperands(X86RAPass *self,Operand_ *opArray,uint32_t opCount)

{
  Slot **ppSVar1;
  X86RegMask *pXVar2;
  uint8_t *puVar3;
  uint32_t *puVar4;
  byte *pbVar5;
  uint8_t **ppuVar6;
  Slot *pSVar7;
  code cVar8;
  uint uVar9;
  CodeBuilder *pCVar10;
  ulong uVar11;
  Zone *pZVar12;
  Zone *pZVar13;
  Slot *pSVar14;
  TiedReg *pTVar15;
  _func_int *p_Var16;
  ulong uVar17;
  RAPass *this;
  char cVar18;
  byte bVar19;
  byte bVar20;
  ushort uVar21;
  ushort uVar22;
  uint uVar23;
  uint *in_RAX;
  long *plVar24;
  bool bVar25;
  code cVar26;
  undefined1 uVar27;
  uint uVar28;
  uint32_t extraout_EDX;
  long lVar29;
  ulong uVar30;
  Imm *src;
  byte bVar31;
  uint uVar32;
  long lVar33;
  byte bVar34;
  uint uVar35;
  VirtReg *pVVar36;
  X86RAPass *pXVar37;
  uint uVar38;
  uint *puVar39;
  undefined2 uVar40;
  uint uVar41;
  int iVar42;
  uint uVar43;
  long lVar44;
  _func_int **pp_Var45;
  ulong uVar46;
  long lVar47;
  char *pcVar48;
  X86RAPass *unaff_R14;
  X86RAPass *pXVar49;
  uint32_t uVar50;
  VirtReg *pVVar51;
  uint uStack_a8;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_80;
  VirtReg *pVStack_70;
  Operand_ *pOStack_68;
  long lStack_60;
  long lStack_58;
  X86RAPass *pXStack_50;
  CodeBuilder *pCStack_48;
  code *pcStack_40;
  uint *local_38;
  
  if (opCount != 0) {
    pCVar10 = (self->super_RAPass).super_CBPass._cb;
    puVar39 = (uint *)((long)&opArray->field_0 + 4);
    lVar44 = (ulong)opCount << 4;
    lVar33 = 0;
    lVar47 = 0;
    pVVar36 = (VirtReg *)opArray;
    local_38 = in_RAX;
    do {
      uVar32 = *(uint *)((long)&opArray->field_0 + lVar33);
      in_RAX = (uint *)(ulong)uVar32;
      if ((uVar32 & 7) == 2) {
        if ((uVar32 & 0xf8) < 9) {
LAB_00130390:
          uVar32 = *(uint *)((long)&opArray->field_0 + lVar33) & 0x1f00;
          in_RAX = (uint *)(ulong)uVar32;
          if (0x100 < uVar32) {
            uVar32 = *(uint *)((long)&opArray->field_0 + lVar33 + 4);
            in_RAX = (uint *)(ulong)uVar32;
            uVar46._0_4_ = pCVar10[1].super_CodeEmitter._privateData;
            uVar46._4_4_ = pCVar10[1].super_CodeEmitter._globalHints;
            if (uVar32 - 0x100 < uVar46) {
              if (uVar32 == 0xffffffff) goto LAB_00130404;
              in_RAX = (uint *)((long)puVar39 + lVar33);
              bVar34 = *(byte *)(*(long *)(*(long *)&pCVar10[1].super_CodeEmitter._type +
                                          (ulong)(uVar32 - 0x100) * 8) + 0x25);
              goto LAB_001303c7;
            }
          }
          goto LAB_001303cc;
        }
        iVar42 = *(int *)((long)&opArray->field_0 + lVar33 + 0xc);
        uVar46 = (ulong)(iVar42 - 0x100);
        uVar30._0_4_ = pCVar10[1].super_CodeEmitter._privateData;
        uVar30._4_4_ = pCVar10[1].super_CodeEmitter._globalHints;
        if (uVar30 <= uVar46) goto LAB_00130390;
        if (iVar42 == -1) goto LAB_001303ff;
        pVVar36 = *(VirtReg **)(*(long *)&pCVar10[1].super_CodeEmitter._type + uVar46 * 8);
        if ((short)uVar32 < 0) {
          if (pVVar36->_memCell == (RACell *)0x0) {
            pcStack_40 = (code *)0x130383;
            local_38 = puVar39;
            RAPass::_newVarCell(&self->super_RAPass,pVVar36);
            puVar39 = local_38;
            unaff_R14 = self;
          }
          goto LAB_00130390;
        }
        if (pVVar36->_physId != 0xff) {
          *(uint *)((long)&opArray->field_0 + lVar33 + 0xc) = (uint)pVVar36->_physId;
          goto LAB_00130390;
        }
LAB_00130409:
        pcStack_40 = X86CallAlloc::run;
        X86RAPass_translateOperands();
        pZVar12 = *(Zone **)&pVVar36->_homeMask;
        (self->super_RAPass).super_CBPass._name = (char *)pVVar36;
        (self->super_RAPass)._zone = pZVar12;
        ((self->super_RAPass).super_CBPass._cb)->_cursor = *(CBNode **)pVVar36;
        (self->super_RAPass)._heap._zone = (Zone *)&pZVar12[1]._blockSize;
        (self->super_RAPass)._heap._slots[1] =
             (Slot *)(&pZVar12[1]._blockSize + (ulong)*(byte *)((long)&pZVar12[1]._block + 2) * 6);
        (self->super_RAPass)._heap._slots[2] =
             (Slot *)(&pZVar12[1]._blockSize + (ulong)*(byte *)((long)&pZVar12[1]._block + 3) * 6);
        (self->super_RAPass)._heap._slots[0] =
             (Slot *)(&pZVar12[1]._blockSize + (ulong)*(byte *)((long)&pZVar12[1]._block + 1) * 6);
        uVar32 = *(uint *)&pZVar12->_block;
        *(uint *)((self->super_RAPass)._heap._slots + 3) = uVar32;
        *(undefined4 *)((long)(self->super_RAPass)._heap._slots + 0x1c) =
             *(undefined4 *)((long)&pZVar12[1]._block + 4);
        *(undefined4 *)((self->super_RAPass)._heap._slots + 4) = 0;
        if ((ulong)uVar32 != 0) {
          lVar29 = 0;
          do {
            pZVar13 = (self->super_RAPass)._heap._zone;
            *(long *)(*(long *)((long)&pZVar13->_ptr + lVar29) + 0x30) =
                 (long)&pZVar13->_ptr + lVar29;
            lVar29 = lVar29 + 0x18;
          } while ((ulong)uVar32 * 0x18 != lVar29);
        }
        (self->super_RAPass)._heap._slots[5] = (Slot *)0x0;
        uVar32._0_1_ = pVVar36[2]._state;
        uVar32._1_1_ = pVVar36[2]._physId;
        uVar32._2_1_ = pVVar36[2]._modified;
        uVar32._3_1_ = pVVar36[2].field_0x27;
        uVar38 = uVar32 & 0xffff;
        *(short *)((self->super_RAPass)._heap._slots + 5) = (short)uVar32;
        *(undefined1 *)((long)(self->super_RAPass)._heap._slots + 0x2a) =
             *(undefined1 *)((long)&pVVar36[2]._memCell + 4);
        *(undefined1 *)((long)(self->super_RAPass)._heap._slots + 0x2b) =
             *(undefined1 *)&pVVar36[2]._tied;
        *(undefined4 *)((long)(self->super_RAPass)._heap._slots + 0x2c) =
             *(undefined4 *)&pVVar36[2]._memCell;
        (self->super_RAPass)._heap._slots[6] = (Slot *)0x0;
        uVar43 = ~uVar38 & (uint)*(ushort *)&pZVar12[1]._end;
        pp_Var45 = (self->super_RAPass).super_CBPass._vptr_CBPass;
        pZVar13 = (self->super_RAPass)._heap._zone;
        bVar34 = *(byte *)((long)(self->super_RAPass)._heap._slots + 0x1c);
        uVar32 = ~(uint)*(ushort *)&pZVar12[1]._end;
        pVStack_70 = pVVar36;
        pOStack_68 = opArray;
        lStack_60 = lVar44;
        lStack_58 = lVar47;
        pXStack_50 = unaff_R14;
        pCStack_48 = pCVar10;
        pcStack_40 = (code *)lVar33;
        if (bVar34 != 0) {
          lVar33 = 0;
          do {
            uVar41 = *(uint *)((long)&pZVar13->_end + lVar33);
            bVar19 = *(byte *)(*(long *)((long)&pZVar13->_ptr + lVar33) + 0x25);
            uVar23 = 0;
            if (bVar19 != 0xff) {
              if (bVar19 < 0x20) {
                uVar23 = 1 << (bVar19 & 0x1f);
                goto LAB_0013054d;
              }
              goto LAB_001325d3;
            }
LAB_0013054d:
            if ((uVar41 & 1) != 0) {
              uVar28 = *(uint *)((long)&pZVar13->_block + lVar33);
              if (uVar28 == 0) {
                uVar28 = *(uint *)((long)&pZVar13->_block + lVar33 + 4);
              }
              if (((uVar28 & uVar23) == 0) && (((uVar23 & uVar32) == 0 || ((uVar41 & 0x1000) != 0)))
                 ) goto LAB_00130556;
              *(byte *)((long)&pZVar13->_end + lVar33 + 5) = bVar19;
              *(uint *)((long)&pZVar13->_end + lVar33) = uVar41 | 0x400000;
              if (*(char *)((self->super_RAPass)._heap._slots + 4) != -1) goto LAB_001305b7;
              goto LAB_0013266e;
            }
            if (uVar23 == 0) {
              *(uint *)((long)&pZVar13->_end + lVar33) = uVar41 | 0x400000;
              if (*(char *)((self->super_RAPass)._heap._slots + 4) != -1) {
LAB_001305b7:
                ppSVar1 = (self->super_RAPass)._heap._slots + 4;
                *(int *)ppSVar1 = *(int *)ppSVar1 + 1;
                goto LAB_001305ba;
              }
              goto LAB_00132722;
            }
LAB_00130556:
            uVar43 = uVar43 | uVar23;
LAB_001305ba:
            lVar33 = lVar33 + 0x18;
            if ((ulong)((uint)bVar34 * 8) * 3 == lVar33) break;
          } while( true );
        }
        uVar41 = 0;
        uVar40 = 0;
        if (bVar34 != 0) {
          uVar43 = ~uVar43 & (uint)*(ushort *)(pp_Var45 + 0x53);
          uVar30 = 0;
          while (((ulong)(&pZVar13->_end)[uVar30 * 3] & 0x400001) != 1) {
LAB_001307c3:
            uVar40 = (undefined2)uVar41;
            uVar30 = uVar30 + 1;
            if (uVar30 == bVar34) goto LAB_001307cf;
          }
          uVar23 = *(uint *)(&pZVar13->_block + uVar30 * 3);
          if (uVar23 != 0) {
            iVar42 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> iVar42 & 1) == 0; iVar42 = iVar42 + 1) {
              }
            }
            *(char *)((long)&pZVar13->_end + uVar30 * 0x18 + 5) = (char)iVar42;
            uVar28 = uVar43;
LAB_001307ba:
            uVar41 = uVar41 | uVar23 & uVar43;
            uVar43 = uVar28;
            goto LAB_001307c3;
          }
          uVar23 = ~uVar38 & *(uint *)((long)&pZVar13->_block + uVar30 * 0x18 + 4);
          if (uVar23 == 0) goto LAB_0013272c;
          uVar28 = uVar23;
          if ((uVar23 & uVar23 - 1) != 0) {
            pcVar48 = (self->super_RAPass).super_CBPass._name;
            iVar42 = 0;
            uVar35 = uVar23;
            do {
              if (((*(ushort *)(pcVar48 + 0x12) & 0xa0) != 0) ||
                 (((*(ushort *)(pcVar48 + 0x12) & 0x10) != 0 &&
                  (pcVar48 = *(char **)(pcVar48 + 0x48), pcVar48 == (char *)0x0)))) {
LAB_00130744:
                uVar28 = uVar35;
                break;
              }
              pcVar48 = *(char **)(pcVar48 + 8);
              if (pcVar48 == (char *)0x0) goto LAB_00132600;
              lVar33 = *(long *)(pcVar48 + 0x20);
              if (lVar33 == 0) {
                cVar18 = '\0';
                uVar28 = uVar23;
              }
              else {
                uVar28 = (uint)*(byte *)(lVar33 + 0x34);
                if (*(byte *)(lVar33 + 0x34) != 0) {
                  plVar24 = (long *)(lVar33 + (ulong)*(byte *)(lVar33 + 0x30) * 0x18 + 0x38);
                  do {
                    if ((uint8_t *)*plVar24 == (&pZVar13->_ptr)[uVar30 * 3]) goto LAB_001306bf;
                    plVar24 = plVar24 + 3;
                    uVar28 = uVar28 - 1;
                  } while (uVar28 != 0);
                }
                plVar24 = (long *)0x0;
LAB_001306bf:
                if (plVar24 != (long *)0x0) {
                  uVar9 = *(uint *)(plVar24 + 2);
                  if (uVar9 == 0) {
                    cVar18 = '\0';
                    uVar28 = uVar23;
                  }
                  else {
                    uVar28 = uVar9 & uVar23;
                    if (uVar28 != 0) {
                      uStack_a8 = uVar28;
                    }
                    cVar18 = (uVar28 == 0) * '\b' + '\x01';
                    uVar35 = uVar23;
                  }
                  uVar23 = uVar28;
                  uVar28 = uVar23;
                  if (uVar9 != 0) goto LAB_00130721;
                }
                uVar28 = ~(uint)(ushort)(*(ushort *)(lVar33 + 0x28) |
                                        *(ushort *)(lVar33 + 0x20) | *(ushort *)(lVar33 + 0x18)) &
                         uVar23;
                cVar18 = (uVar28 == 0) << 2;
                uVar35 = uVar23;
              }
LAB_00130721:
              uVar23 = uVar28;
              if (cVar18 != '\0') {
                if ((cVar18 == '\x04') || (uVar28 = uStack_a8, cVar18 == '\t')) goto LAB_00130744;
                break;
              }
              iVar42 = iVar42 + 1;
              uVar28 = uVar35;
            } while (iVar42 != 0x40);
          }
          if (uVar28 == 0) goto LAB_00132731;
          uVar23 = ~uVar43 & uVar28;
          if (((~uVar43 & uVar28) == 0) &&
             (uVar23 = uVar43 & uVar28 & ~(uint)*(ushort *)(pp_Var45 + 0x54), uVar23 == 0)) {
            uVar23 = uVar28;
          }
          uVar28 = uVar23 & uVar32;
          if (uVar28 == 0) {
            uVar28 = uVar23;
          }
          if (((ulong)(&pZVar13->_end)[uVar30 * 3] & 0x1002) != 0) {
            uVar28 = uVar23;
          }
          uVar35 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
            }
          }
          if (uVar28 == 0) {
            uVar35 = 0xffffffff;
          }
          if (uVar35 < 0x20) {
            uVar23 = 1 << ((byte)uVar35 & 0x1f);
            *(byte *)((long)&pZVar13->_end + uVar30 * 0x18 + 5) = (byte)uVar35;
            *(uint *)(&pZVar13->_block + uVar30 * 3) = uVar23;
            uVar38 = uVar38 | 1 << (uVar35 & 0x1f);
            uVar28 = uVar43 | 1 << (uVar35 & 0x1f);
            goto LAB_001307ba;
          }
          goto LAB_00132736;
        }
LAB_001307cf:
        *(undefined2 *)((self->super_RAPass)._heap._slots + 6) = uVar40;
        *(short *)((self->super_RAPass)._heap._slots + 5) = (short)uVar38;
        pp_Var45 = (self->super_RAPass).super_CBPass._vptr_CBPass;
        bVar34 = *(byte *)((long)(self->super_RAPass)._heap._slots + 0x2a);
        uVar38 = (uint)*(byte *)((long)&(self->super_RAPass)._zone[1]._end + 2);
        uVar32 = ~(uint)bVar34 & uVar38;
        pSVar14 = (self->super_RAPass)._heap._slots[1];
        bVar19 = *(byte *)((long)(self->super_RAPass)._heap._slots + 0x1e);
        if (bVar19 != 0) {
          lVar33 = 0;
          do {
            uVar43 = *(uint *)((long)&pSVar14[1].next + lVar33);
            bVar31 = *(byte *)(*(long *)((long)&pSVar14->next + lVar33) + 0x25);
            uVar41 = 0;
            if (bVar31 != 0xff) {
              if (bVar31 < 0x20) {
                uVar41 = 1 << (bVar31 & 0x1f);
                goto LAB_00130841;
              }
              goto LAB_001325d8;
            }
LAB_00130841:
            if ((uVar43 & 1) != 0) {
              uVar23 = *(uint *)((long)&pSVar14[2].next + lVar33);
              if (uVar23 == 0) {
                uVar23 = *(uint *)((long)&pSVar14[2].next + lVar33 + 4);
              }
              if (((uVar23 & uVar41) == 0) &&
                 (((uVar41 & ~uVar38) == 0 || ((uVar43 & 0x1000) != 0)))) goto LAB_0013084a;
              *(byte *)((long)&pSVar14[1].next + lVar33 + 5) = bVar31;
              *(uint *)((long)&pSVar14[1].next + lVar33) = uVar43 | 0x400000;
              if (*(char *)((long)(self->super_RAPass)._heap._slots + 0x22) != -1)
              goto LAB_001308ab;
              goto LAB_0013269b;
            }
            if (uVar41 == 0) {
              *(uint *)((long)&pSVar14[1].next + lVar33) = uVar43 | 0x400000;
              if (*(char *)((long)(self->super_RAPass)._heap._slots + 0x22) != -1) {
LAB_001308ab:
                ppSVar1 = (self->super_RAPass)._heap._slots + 4;
                *(int *)ppSVar1 = *(int *)ppSVar1 + 0x10000;
                goto LAB_001308b2;
              }
              goto LAB_0013273b;
            }
LAB_0013084a:
            uVar32 = uVar32 | uVar41;
LAB_001308b2:
            lVar33 = lVar33 + 0x18;
            if ((ulong)((uint)bVar19 * 8) * 3 == lVar33) break;
          } while( true );
        }
        uVar38 = 0;
        uVar27 = 0;
        if (bVar19 != 0) {
          bVar31 = *(byte *)((long)pp_Var45 + 0x29a);
          lVar33 = 0;
          while ((*(uint *)((long)&pSVar14[1].next + lVar33) & 0x400001) != 1) {
LAB_0013090d:
            uVar27 = (undefined1)uVar38;
            lVar33 = lVar33 + 0x18;
            if ((ulong)bVar19 * 0x18 == lVar33) goto LAB_00130916;
          }
          uVar43 = *(uint *)((long)&pSVar14[2].next + lVar33);
          if (uVar43 != 0) {
            iVar42 = 0;
            if (uVar43 != 0) {
              for (; (uVar43 >> iVar42 & 1) == 0; iVar42 = iVar42 + 1) {
              }
            }
            *(char *)((long)&pSVar14[1].next + lVar33 + 5) = (char)iVar42;
            uVar38 = uVar38 | uVar43 & ~uVar32 & (uint)bVar31;
            goto LAB_0013090d;
          }
          goto LAB_00132623;
        }
LAB_00130916:
        *(undefined1 *)((long)(self->super_RAPass)._heap._slots + 0x32) = uVar27;
        *(byte *)((long)(self->super_RAPass)._heap._slots + 0x2a) = bVar34;
        pp_Var45 = (self->super_RAPass).super_CBPass._vptr_CBPass;
        uVar32 = *(uint *)((long)&(self->super_RAPass)._zone[1]._end + 4);
        uVar38 = *(uint *)((long)(self->super_RAPass)._heap._slots + 0x2c);
        uVar43 = ~uVar38 & uVar32;
        pSVar14 = (self->super_RAPass)._heap._slots[0];
        bVar34 = *(byte *)((long)(self->super_RAPass)._heap._slots + 0x1d);
        if (bVar34 != 0) {
          lVar33 = 0;
          do {
            uVar41 = *(uint *)((long)&pSVar14[1].next + lVar33);
            bVar19 = *(byte *)(*(long *)((long)&pSVar14->next + lVar33) + 0x25);
            uVar23 = 0;
            if (bVar19 != 0xff) {
              if (bVar19 < 0x20) {
                uVar23 = 1 << (bVar19 & 0x1f);
                goto LAB_00130986;
              }
              goto LAB_001325dd;
            }
LAB_00130986:
            if ((uVar41 & 1) != 0) {
              uVar28 = *(uint *)((long)&pSVar14[2].next + lVar33);
              if (uVar28 == 0) {
                uVar28 = *(uint *)((long)&pSVar14[2].next + lVar33 + 4);
              }
              if (((uVar28 & uVar23) == 0) &&
                 (((uVar23 & ~uVar32) == 0 || ((uVar41 & 0x1000) != 0)))) goto LAB_0013098f;
              *(byte *)((long)&pSVar14[1].next + lVar33 + 5) = bVar19;
              *(uint *)((long)&pSVar14[1].next + lVar33) = uVar41 | 0x400000;
              if (*(char *)((long)(self->super_RAPass)._heap._slots + 0x21) != -1)
              goto LAB_001309f0;
              goto LAB_001326a0;
            }
            if (uVar23 == 0) {
              *(uint *)((long)&pSVar14[1].next + lVar33) = uVar41 | 0x400000;
              if (*(char *)((long)(self->super_RAPass)._heap._slots + 0x21) != -1) {
LAB_001309f0:
                ppSVar1 = (self->super_RAPass)._heap._slots + 4;
                *(int *)ppSVar1 = *(int *)ppSVar1 + 0x100;
                goto LAB_001309f7;
              }
              goto LAB_00132740;
            }
LAB_0013098f:
            uVar43 = uVar43 | uVar23;
LAB_001309f7:
            lVar33 = lVar33 + 0x18;
            if ((ulong)((uint)bVar34 * 8) * 3 == lVar33) break;
          } while( true );
        }
        if (bVar34 != 0) {
          uVar32 = *(uint *)((long)pp_Var45 + 0x29c);
          lVar33 = 0;
          uVar41 = 0;
          while ((*(uint *)((long)&pSVar14[1].next + lVar33) & 0x400001) != 1) {
LAB_00130a4f:
            lVar33 = lVar33 + 0x18;
            if ((ulong)bVar34 * 0x18 == lVar33) goto LAB_00130a5c;
          }
          uVar23 = *(uint *)((long)&pSVar14[2].next + lVar33);
          if (uVar23 != 0) {
            iVar42 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> iVar42 & 1) == 0; iVar42 = iVar42 + 1) {
              }
            }
            *(char *)((long)&pSVar14[1].next + lVar33 + 5) = (char)iVar42;
            uVar41 = uVar41 | uVar23 & ~uVar43 & uVar32;
            goto LAB_00130a4f;
          }
          goto LAB_00132628;
        }
        uVar41 = 0;
LAB_00130a5c:
        *(uint *)((long)(self->super_RAPass)._heap._slots + 0x34) = uVar41;
        *(uint *)((long)(self->super_RAPass)._heap._slots + 0x2c) = uVar38;
        uVar21 = *(ushort *)((self->super_RAPass)._heap._slots + 6);
        if (uVar21 != 0) {
          pp_Var45 = (self->super_RAPass).super_CBPass._vptr_CBPass;
          uVar30 = 0xffffffff;
          uVar32 = (uint)uVar21;
          while( true ) {
            iVar42 = 0;
            if (uVar32 != 0) {
              for (; (uVar32 >> iVar42 & 1) == 0; iVar42 = iVar42 + 1) {
              }
            }
            bVar34 = (char)iVar42 + 1U & 0x1f;
            uVar30 = (ulong)((int)uVar30 + iVar42 + 1);
            pVVar36 = (VirtReg *)pp_Var45[uVar30 + 0x2b];
            if ((pVVar36 == (VirtReg *)0x0) || (pVVar36->_tied != (TiedReg *)0x0))
            goto LAB_00132560;
            if (((pVVar36->_regInfo)._signature & 0xf00) != 0) goto LAB_001325a6;
            pXVar49 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
            if (pVVar36->_state == '\x01') break;
LAB_00130b54:
            X86RAPass::_checkState(pXVar49);
            uVar38 = uVar32 >> bVar34;
            uVar32 = uVar32 >> bVar34;
            if (uVar38 == 0) goto LAB_00130b68;
          }
          bVar19 = pVVar36->_physId;
          if (bVar19 == 0xff) goto LAB_0013262d;
          if ((pXVar49->_x86State).field_0._list[bVar19] != pVVar36) goto LAB_00132632;
          if (pVVar36->_modified != '\0') {
            X86RAPass::emitSave(pXVar49,pVVar36,(uint)bVar19,"Spill");
          }
          if (((pVVar36->_regInfo)._signature & 0xf00) != 0) goto LAB_00132637;
          if (pVVar36->_physId != bVar19) goto LAB_0013263c;
          if (bVar19 < 0x20) {
            pVVar36->_state = '\x02';
            pVVar36->_physId = 0xff;
            pVVar36->_modified = '\0';
            uVar21 = (ushort)(-2 << (bVar19 & 0x1f)) |
                     (ushort)(0xfffffffe >> 0x20 - (bVar19 & 0x1f));
            (pXVar49->_x86State).field_0._list[bVar19] = (VirtReg *)0x0;
            pXVar2 = &(pXVar49->_x86State)._occupied;
            (pXVar2->field_0).field_0._gp = (pXVar2->field_0).field_0._gp & uVar21;
            pXVar2 = &(pXVar49->_x86State)._modified;
            (pXVar2->field_0).field_0._gp = (pXVar2->field_0).field_0._gp & uVar21;
            X86RAPass::_checkState(pXVar49);
            goto LAB_00130b54;
          }
          goto LAB_00132641;
        }
LAB_00130b68:
        bVar34 = *(byte *)((long)(self->super_RAPass)._heap._slots + 0x32);
        if (bVar34 != 0) {
          pp_Var45 = (self->super_RAPass).super_CBPass._vptr_CBPass;
          uVar30 = 0xffffffff;
          uVar32 = (uint)bVar34;
          while( true ) {
            iVar42 = 0;
            if (uVar32 != 0) {
              for (; (uVar32 >> iVar42 & 1) == 0; iVar42 = iVar42 + 1) {
              }
            }
            bVar34 = (char)iVar42 + 1U & 0x1f;
            uVar30 = (ulong)((int)uVar30 + iVar42 + 1);
            pVVar36 = (VirtReg *)pp_Var45[uVar30 + 0x3b];
            if ((pVVar36 == (VirtReg *)0x0) || (pVVar36->_tied != (TiedReg *)0x0))
            goto LAB_00132565;
            if (((pVVar36->_regInfo)._signature & 0xf00) != 0x200) goto LAB_001325ab;
            pXVar49 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
            if (pVVar36->_state == '\x01') break;
LAB_00130c67:
            X86RAPass::_checkState(pXVar49);
            uVar38 = uVar32 >> bVar34;
            uVar32 = uVar32 >> bVar34;
            if (uVar38 == 0) goto LAB_00130c7b;
          }
          bVar19 = pVVar36->_physId;
          if (bVar19 == 0xff) goto LAB_00132646;
          if (*(VirtReg **)((long)&(pXVar49->_x86State).field_0 + (ulong)bVar19 * 8 + 0x80) !=
              pVVar36) goto LAB_0013264b;
          if (pVVar36->_modified != '\0') {
            X86RAPass::emitSave(pXVar49,pVVar36,(uint)bVar19,"Spill");
          }
          if (((pVVar36->_regInfo)._signature & 0xf00) != 0x200) goto LAB_00132650;
          if (pVVar36->_physId != bVar19) goto LAB_00132655;
          if (bVar19 < 0x20) {
            pVVar36->_state = '\x02';
            pVVar36->_physId = 0xff;
            pVVar36->_modified = '\0';
            *(undefined8 *)((long)&(pXVar49->_x86State).field_0 + (ulong)bVar19 * 8 + 0x80) = 0;
            bVar19 = ~(byte)(1 << (bVar19 & 0x1f));
            puVar3 = &(pXVar49->_x86State)._occupied.field_0.field_0._mm;
            *puVar3 = *puVar3 & bVar19;
            puVar3 = &(pXVar49->_x86State)._modified.field_0.field_0._mm;
            *puVar3 = *puVar3 & bVar19;
            X86RAPass::_checkState(pXVar49);
            goto LAB_00130c67;
          }
          goto LAB_0013265a;
        }
LAB_00130c7b:
        uVar32 = *(uint *)((long)(self->super_RAPass)._heap._slots + 0x34);
        if (uVar32 != 0) {
          pp_Var45 = (self->super_RAPass).super_CBPass._vptr_CBPass;
          uVar30 = 0xffffffff;
          while( true ) {
            iVar42 = 0;
            if (uVar32 != 0) {
              for (; (uVar32 >> iVar42 & 1) == 0; iVar42 = iVar42 + 1) {
              }
            }
            bVar34 = (char)iVar42 + 1U & 0x1f;
            uVar30 = (ulong)((int)uVar30 + iVar42 + 1);
            pVVar36 = (VirtReg *)pp_Var45[uVar30 + 0x43];
            if ((pVVar36 == (VirtReg *)0x0) || (pVVar36->_tied != (TiedReg *)0x0))
            goto LAB_0013256a;
            if (((pVVar36->_regInfo)._signature & 0xf00) != 0x100) goto LAB_001325b0;
            pXVar49 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
            if (pVVar36->_state == '\x01') break;
LAB_00130d77:
            X86RAPass::_checkState(pXVar49);
            uVar38 = uVar32 >> bVar34;
            uVar32 = uVar32 >> bVar34;
            if (uVar38 == 0) goto LAB_00130d8b;
          }
          bVar19 = pVVar36->_physId;
          if (bVar19 == 0xff) goto LAB_00132682;
          if (*(VirtReg **)((long)&(pXVar49->_x86State).field_0 + (ulong)bVar19 * 8 + 0xc0) !=
              pVVar36) goto LAB_00132687;
          if (pVVar36->_modified != '\0') {
            X86RAPass::emitSave(pXVar49,pVVar36,(uint)bVar19,"Spill");
          }
          if (((pVVar36->_regInfo)._signature & 0xf00) != 0x100) goto LAB_0013268c;
          if (pVVar36->_physId != bVar19) goto LAB_00132691;
          if (bVar19 < 0x20) {
            pVVar36->_state = '\x02';
            pVVar36->_physId = 0xff;
            pVVar36->_modified = '\0';
            uVar38 = -2 << (bVar19 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar19 & 0x1f);
            *(undefined8 *)((long)&(pXVar49->_x86State).field_0 + (ulong)bVar19 * 8 + 0xc0) = 0;
            puVar4 = &(pXVar49->_x86State)._occupied.field_0.field_0._vec;
            *puVar4 = *puVar4 & uVar38;
            puVar4 = &(pXVar49->_x86State)._modified.field_0.field_0._vec;
            *puVar4 = *puVar4 & uVar38;
            X86RAPass::_checkState(pXVar49);
            goto LAB_00130d77;
          }
          goto LAB_00132696;
        }
LAB_00130d8b:
        bVar34 = *(byte *)((long)(self->super_RAPass)._heap._slots + 0x1c);
        if ((*(byte *)((self->super_RAPass)._heap._slots + 4) != bVar34) && (bVar34 != 0)) {
          pZVar12 = (self->super_RAPass)._heap._zone;
          do {
            lVar33 = 0;
            bVar25 = false;
            do {
              if ((*(uint *)((long)&pZVar12->_end + lVar33) & 0x400001) == 1) {
                pVVar36 = *(VirtReg **)((long)&pZVar12->_ptr + lVar33);
                bVar19 = pVVar36->_physId;
                bVar31 = *(byte *)((long)&pZVar12->_end + lVar33 + 5);
                if (bVar19 == bVar31) goto LAB_0013255b;
                pXVar49 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
                pVVar51 = (pXVar49->_x86State).field_0._list[bVar31];
                if (pVVar51 == (VirtReg *)0x0) {
                  uVar32 = (pVVar36->_regInfo)._signature;
                  if (bVar19 == 0xff) {
                    if ((uVar32 & 0xf00) != 0) goto LAB_001326be;
                    if (bVar31 == 0xff) goto LAB_001326c3;
                    if (0x1f < bVar31) goto LAB_001326c8;
                    uVar32 = 1 << (bVar31 & 0x1f);
                    if ((pXVar49->_x86State).field_0._list[bVar31] != (VirtReg *)0x0)
                    goto LAB_001326cd;
                    if (pVVar36->_state == '\x02') {
                      X86RAPass::emitLoad(pXVar49,pVVar36,(uint)bVar31,"Alloc");
                    }
                    else if (pVVar36->_state == '\x01') {
                      X86RAPass::emitMove(pXVar49,pVVar36,(uint)bVar31,(uint)bVar19,"Alloc");
                      (pXVar49->_x86State).field_0._list[bVar19] = (VirtReg *)0x0;
                      goto LAB_001328b7;
                    }
                    pVVar36->_modified = '\0';
                    pVVar36->_state = '\x01';
                    pVVar36->_physId = bVar31;
                    pVVar36->_homeMask = pVVar36->_homeMask | uVar32;
                    (pXVar49->_x86State).field_0._list[bVar31] = pVVar36;
                    pXVar2 = &(pXVar49->_x86State)._occupied;
                    uVar22 = (ushort)uVar32;
                    (pXVar2->field_0).field_0._gp = (pXVar2->field_0).field_0._gp ^ uVar22;
                    uVar21 = uVar22;
                    if (pVVar36->_modified == '\0') {
                      uVar21 = 0;
                    }
                    pXVar2 = &(pXVar49->_x86State)._modified;
                    (pXVar2->field_0).field_0._gp = (pXVar2->field_0).field_0._gp ^ uVar21;
                    X86RAPass::_checkState(pXVar49);
                    pp_Var45 = (self->super_RAPass).super_CBPass._vptr_CBPass + 0x56;
                    *(ushort *)pp_Var45 = *(ushort *)pp_Var45 | uVar22;
                    pbVar5 = (byte *)((long)&pZVar12->_end + lVar33 + 2);
                    *pbVar5 = *pbVar5 | 0x40;
                    if (*(char *)((self->super_RAPass)._heap._slots + 4) == -1) goto LAB_001326d2;
                  }
                  else {
                    if ((uVar32 & 0xf00) != 0) goto LAB_00132605;
                    if (pVVar36->_state != '\x01') goto LAB_0013260a;
                    X86RAPass::emitMove(pXVar49,pVVar36,(uint)bVar31,(uint)bVar19,"Move");
                    if (((pVVar36->_regInfo)._signature & 0xf00) != 0) goto LAB_0013260f;
                    if (0x1f < bVar31) goto LAB_00132614;
                    if (0x1f < bVar19) goto LAB_00132619;
                    uVar21 = (ushort)(1 << (bVar31 & 0x1f));
                    uVar22 = uVar21 ^ (ushort)(1 << (bVar19 & 0x1f));
                    pVVar36->_physId = bVar31;
                    (pXVar49->_x86State).field_0._list[bVar19] = (VirtReg *)0x0;
                    (pXVar49->_x86State).field_0._list[bVar31] = pVVar36;
                    pXVar2 = &(pXVar49->_x86State)._occupied;
                    (pXVar2->field_0).field_0._gp = (pXVar2->field_0).field_0._gp ^ uVar22;
                    if (pVVar36->_modified == '\0') {
                      uVar22 = 0;
                    }
                    pXVar2 = &(pXVar49->_x86State)._modified;
                    (pXVar2->field_0).field_0._gp = (pXVar2->field_0).field_0._gp ^ uVar22;
                    X86RAPass::_checkState(pXVar49);
                    X86RAPass::_checkState(pXVar49);
                    pp_Var45 = (self->super_RAPass).super_CBPass._vptr_CBPass + 0x56;
                    *(ushort *)pp_Var45 = *(ushort *)pp_Var45 | uVar21;
                    pbVar5 = (byte *)((long)&pZVar12->_end + lVar33 + 2);
                    *pbVar5 = *pbVar5 | 0x40;
                    if (*(char *)((self->super_RAPass)._heap._slots + 4) == -1) goto LAB_0013261e;
                  }
                }
                else {
                  if (pVVar36 == pVVar51) goto LAB_0013256f;
                  if (((pVVar36->_regInfo)._signature & 0xf00) != 0) goto LAB_00132574;
                  if (pVVar36->_state != '\x01') goto LAB_00132579;
                  if (bVar19 == 0xff) goto LAB_0013257e;
                  if (((pVVar51->_regInfo)._signature & 0xf00) != 0) goto LAB_00132583;
                  if (pVVar51->_state != '\x01') goto LAB_00132588;
                  bVar31 = pVVar51->_physId;
                  if (bVar31 == 0xff) goto LAB_0013258d;
                  pTVar15 = pVVar51->_tied;
                  X86RAPass::emitSwapGp(pXVar49,pVVar36,pVVar51,(uint)bVar19,(uint)bVar31,"Swap");
                  pVVar36->_physId = bVar31;
                  pVVar51->_physId = bVar19;
                  (pXVar49->_x86State).field_0._list[bVar19] = pVVar51;
                  (pXVar49->_x86State).field_0._list[bVar31] = pVVar36;
                  bVar25 = (pVVar51->_modified != '\0') != (pVVar36->_modified != '\0');
                  pXVar2 = &(pXVar49->_x86State)._modified;
                  (pXVar2->field_0).field_0._gp =
                       (pXVar2->field_0).field_0._gp ^
                       ((ushort)bVar25 << (bVar31 & 0x1f) | (ushort)bVar25 << (bVar19 & 0x1f));
                  X86RAPass::_checkState(pXVar49);
                  pbVar5 = (byte *)((long)&pZVar12->_end + lVar33 + 2);
                  *pbVar5 = *pbVar5 | 0x40;
                  if (*(char *)((self->super_RAPass)._heap._slots + 4) == -1) goto LAB_00132592;
                  ppSVar1 = (self->super_RAPass)._heap._slots + 4;
                  *(int *)ppSVar1 = *(int *)ppSVar1 + 1;
                  bVar25 = true;
                  if ((pTVar15 == (TiedReg *)0x0) || (bVar19 != (pTVar15->field_2).field_0.inPhysId)
                     ) goto LAB_00131102;
                  pbVar5 = (byte *)((long)&pTVar15->flags + 2);
                  *pbVar5 = *pbVar5 | 0x40;
                  if (*(char *)((self->super_RAPass)._heap._slots + 4) == -1) goto LAB_0013265f;
                }
                ppSVar1 = (self->super_RAPass)._heap._slots + 4;
                *(int *)ppSVar1 = *(int *)ppSVar1 + 1;
                bVar25 = true;
              }
LAB_00131102:
              lVar33 = lVar33 + 0x18;
            } while ((ulong)bVar34 * 0x18 != lVar33);
          } while ((bVar34 != 0) && (bVar25));
        }
        bVar34 = *(byte *)((long)(self->super_RAPass)._heap._slots + 0x1e);
        if ((*(byte *)((long)(self->super_RAPass)._heap._slots + 0x22) != bVar34) && (bVar34 != 0))
        {
          pSVar14 = (self->super_RAPass)._heap._slots[1];
          do {
            lVar33 = 0;
            bVar25 = false;
            do {
              if ((*(uint *)((long)&pSVar14[1].next + lVar33) & 0x400001) == 1) {
                pVVar36 = *(VirtReg **)((long)&pSVar14->next + lVar33);
                bVar19 = pVVar36->_physId;
                pVVar51 = (VirtReg *)(ulong)bVar19;
                bVar31 = *(byte *)((long)&pSVar14[1].next + lVar33 + 5);
                if (bVar19 == bVar31) {
                  X86CallAlloc::run();
                  goto LAB_00132556;
                }
                uVar30 = (ulong)bVar31;
                uVar50 = (uint32_t)bVar31;
                pXVar49 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
                if (*(long *)((long)&(pXVar49->_x86State).field_0 + uVar30 * 8 + 0x80) == 0) {
                  uVar32 = (pVVar36->_regInfo)._signature & 0xf00;
                  uVar38 = (uint)bVar19;
                  if (uVar38 == 0xff) {
                    if (uVar32 != 0x200) goto LAB_00132664;
                    if (bVar31 == 0xff) goto LAB_00132669;
                    if (0x1f < bVar31) goto LAB_00132673;
                    uVar32 = 1 << (bVar31 & 0x1f);
                    if (*(long *)((long)&(pXVar49->_x86State).field_0 + uVar30 * 8 + 0x80) != 0)
                    goto LAB_00132678;
                    if (pVVar36->_state == '\x02') {
                      X86RAPass::emitLoad(pXVar49,pVVar36,(uint)bVar31,"Alloc");
                    }
                    else if (pVVar36->_state == '\x01') goto LAB_00132847;
                    pVVar36->_modified = '\0';
                    pVVar36->_state = '\x01';
                    pVVar36->_physId = bVar31;
                    pVVar36->_homeMask = pVVar36->_homeMask | uVar32;
                    *(VirtReg **)((long)&(pXVar49->_x86State).field_0 + uVar30 * 8 + 0x80) = pVVar36
                    ;
                    puVar3 = &(pXVar49->_x86State)._occupied.field_0.field_0._mm;
                    bVar31 = (byte)uVar32;
                    *puVar3 = *puVar3 ^ bVar31;
                    bVar19 = bVar31;
                    if (pVVar36->_modified == '\0') {
                      bVar19 = 0;
                    }
                    puVar3 = &(pXVar49->_x86State)._modified.field_0.field_0._mm;
                    *puVar3 = *puVar3 ^ bVar19;
                    X86RAPass::_checkState(pXVar49);
                    pbVar5 = (byte *)((long)(self->super_RAPass).super_CBPass._vptr_CBPass + 0x2b2);
                    *pbVar5 = *pbVar5 | bVar31;
                    pbVar5 = (byte *)((long)&pSVar14[1].next + lVar33 + 2);
                    *pbVar5 = *pbVar5 | 0x40;
                    if (*(char *)((long)(self->super_RAPass)._heap._slots + 0x22) == -1)
                    goto LAB_0013267d;
                  }
                  else {
                    if (uVar32 != 0x200) goto LAB_001325b5;
                    if (pVVar36->_state != '\x01') goto LAB_001325ba;
                    X86RAPass::emitMove(pXVar49,pVVar36,(uint)bVar31,uVar38,"Move");
                    if (((pVVar36->_regInfo)._signature & 0xf00) != 0x200) goto LAB_001325bf;
                    if (0x1f < bVar31) goto LAB_001325c4;
                    if (0x1f < bVar19) goto LAB_001325c9;
                    bVar19 = (byte)(1 << (bVar31 & 0x1f));
                    bVar20 = bVar19 ^ (byte)(1 << (uVar38 & 0x1f));
                    pVVar36->_physId = bVar31;
                    *(undefined8 *)((long)&(pXVar49->_x86State).field_0 + (long)pVVar51 * 8 + 0x80)
                         = 0;
                    *(VirtReg **)((long)&(pXVar49->_x86State).field_0 + uVar30 * 8 + 0x80) = pVVar36
                    ;
                    puVar3 = &(pXVar49->_x86State)._occupied.field_0.field_0._mm;
                    *puVar3 = *puVar3 ^ bVar20;
                    if (pVVar36->_modified == '\0') {
                      bVar20 = 0;
                    }
                    puVar3 = &(pXVar49->_x86State)._modified.field_0.field_0._mm;
                    *puVar3 = *puVar3 ^ bVar20;
                    X86RAPass::_checkState(pXVar49);
                    X86RAPass::_checkState(pXVar49);
                    pbVar5 = (byte *)((long)(self->super_RAPass).super_CBPass._vptr_CBPass + 0x2b2);
                    *pbVar5 = *pbVar5 | bVar19;
                    pbVar5 = (byte *)((long)&pSVar14[1].next + lVar33 + 2);
                    *pbVar5 = *pbVar5 | 0x40;
                    if (*(char *)((long)(self->super_RAPass)._heap._slots + 0x22) == -1)
                    goto LAB_001325ce;
                  }
                  ppSVar1 = (self->super_RAPass)._heap._slots + 4;
                  *(int *)ppSVar1 = *(int *)ppSVar1 + 0x10000;
                  bVar25 = true;
                }
              }
              lVar33 = lVar33 + 0x18;
            } while ((ulong)bVar34 * 0x18 != lVar33);
          } while ((bVar34 != 0) && (bVar25));
        }
        bVar34 = *(byte *)((long)(self->super_RAPass)._heap._slots + 0x1d);
        if ((*(byte *)((long)(self->super_RAPass)._heap._slots + 0x21) != bVar34) && (bVar34 != 0))
        {
          pSVar14 = (self->super_RAPass)._heap._slots[0];
          do {
            lVar33 = 0;
            bVar25 = false;
            do {
              if ((*(uint *)((long)&pSVar14[1].next + lVar33) & 0x400001) == 1) {
                pVVar36 = *(VirtReg **)((long)&pSVar14->next + lVar33);
                bVar19 = pVVar36->_physId;
                bVar31 = *(byte *)((long)&pSVar14[1].next + lVar33 + 5);
                if (bVar19 == bVar31) goto LAB_00132556;
                uVar30 = (ulong)bVar31;
                pXVar49 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
                if (*(long *)((long)&(pXVar49->_x86State).field_0 + uVar30 * 8 + 0xc0) == 0) {
                  uVar32 = (pVVar36->_regInfo)._signature & 0xf00;
                  if (bVar19 == 0xff) {
                    if (uVar32 != 0x100) goto LAB_001326a5;
                    if (bVar31 == 0xff) goto LAB_001326aa;
                    if (0x1f < bVar31) goto LAB_001326af;
                    uVar32 = 1 << (bVar31 & 0x1f);
                    if (*(long *)((long)&(pXVar49->_x86State).field_0 + uVar30 * 8 + 0xc0) != 0)
                    goto LAB_001326b4;
                    if (pVVar36->_state == '\x02') {
                      X86RAPass::emitLoad(pXVar49,pVVar36,(uint)bVar31,"Alloc");
                    }
                    else if (pVVar36->_state == '\x01') {
                      X86RAPass::emitMove(pXVar49,pVVar36,(uint)bVar31,0xff,"Alloc");
                      *(undefined8 *)
                       ((long)&(pXVar49->_x86State).field_0 + (ulong)(uint)bVar19 * 8 + 0xc0) = 0;
                      goto LAB_001328b7;
                    }
                    pVVar36->_modified = '\0';
                    pVVar36->_state = '\x01';
                    pVVar36->_physId = bVar31;
                    pVVar36->_homeMask = pVVar36->_homeMask | uVar32;
                    *(VirtReg **)((long)&(pXVar49->_x86State).field_0 + uVar30 * 8 + 0xc0) = pVVar36
                    ;
                    puVar4 = &(pXVar49->_x86State)._occupied.field_0.field_0._vec;
                    *puVar4 = *puVar4 ^ uVar32;
                    uVar38 = uVar32;
                    if (pVVar36->_modified == '\0') {
                      uVar38 = 0;
                    }
                    puVar4 = &(pXVar49->_x86State)._modified.field_0.field_0._vec;
                    *puVar4 = *puVar4 ^ uVar38;
                    X86RAPass::_checkState(pXVar49);
                    puVar39 = (uint *)((long)(self->super_RAPass).super_CBPass._vptr_CBPass + 0x2b4)
                    ;
                    *puVar39 = *puVar39 | uVar32;
                    pbVar5 = (byte *)((long)&pSVar14[1].next + lVar33 + 2);
                    *pbVar5 = *pbVar5 | 0x40;
                    if (*(char *)((long)(self->super_RAPass)._heap._slots + 0x21) == -1)
                    goto LAB_001326b9;
                  }
                  else {
                    if (uVar32 != 0x100) goto LAB_001325e2;
                    if (pVVar36->_state != '\x01') goto LAB_001325e7;
                    X86RAPass::emitMove(pXVar49,pVVar36,(uint)bVar31,(uint)bVar19,"Move");
                    if (((pVVar36->_regInfo)._signature & 0xf00) != 0x100) goto LAB_001325ec;
                    if (0x1f < bVar31) goto LAB_001325f1;
                    if (0x1f < bVar19) goto LAB_001325f6;
                    uVar38 = 1 << (bVar31 & 0x1f);
                    uVar32 = uVar38 ^ 1 << (bVar19 & 0x1f);
                    pVVar36->_physId = bVar31;
                    *(undefined8 *)((long)&(pXVar49->_x86State).field_0 + (ulong)bVar19 * 8 + 0xc0)
                         = 0;
                    *(VirtReg **)((long)&(pXVar49->_x86State).field_0 + uVar30 * 8 + 0xc0) = pVVar36
                    ;
                    puVar4 = &(pXVar49->_x86State)._occupied.field_0.field_0._vec;
                    *puVar4 = *puVar4 ^ uVar32;
                    if (pVVar36->_modified == '\0') {
                      uVar32 = 0;
                    }
                    puVar4 = &(pXVar49->_x86State)._modified.field_0.field_0._vec;
                    *puVar4 = *puVar4 ^ uVar32;
                    X86RAPass::_checkState(pXVar49);
                    X86RAPass::_checkState(pXVar49);
                    puVar39 = (uint *)((long)(self->super_RAPass).super_CBPass._vptr_CBPass + 0x2b4)
                    ;
                    *puVar39 = *puVar39 | uVar38;
                    pbVar5 = (byte *)((long)&pSVar14[1].next + lVar33 + 2);
                    *pbVar5 = *pbVar5 | 0x40;
                    if (*(char *)((long)(self->super_RAPass)._heap._slots + 0x21) == -1)
                    goto LAB_001325fb;
                  }
                  ppSVar1 = (self->super_RAPass)._heap._slots + 4;
                  *(int *)ppSVar1 = *(int *)ppSVar1 + 0x100;
                  bVar25 = true;
                }
              }
              lVar33 = lVar33 + 0x18;
            } while ((ulong)bVar34 * 0x18 != lVar33);
          } while ((bVar34 != 0) && (bVar25));
        }
        pp_Var45 = (self->super_RAPass).super_CBPass._vptr_CBPass;
        uVar32 = (uint)*(ushort *)(pp_Var45 + 0x54) &
                 *(uint *)(pp_Var45 + 0x53) & *(uint *)&(self->super_RAPass)._zone[1]._end;
        if (uVar32 != 0) {
          pp_Var45 = pp_Var45 + 0x2b;
          while ((uVar32 & 1) == 0) {
LAB_001316c2:
            pp_Var45 = pp_Var45 + 1;
            bVar25 = uVar32 < 2;
            uVar32 = uVar32 >> 1;
            if (bVar25) goto LAB_001316d8;
          }
          pVVar36 = (VirtReg *)*pp_Var45;
          if (pVVar36 == (VirtReg *)0x0) goto LAB_001326d7;
          if (pVVar36->_modified == '\0') goto LAB_001326dc;
          if ((pVVar36->_tied != (TiedReg *)0x0) && ((pVVar36->_tied->flags & 0x1002) != 0))
          goto LAB_001316c2;
          if (((pVVar36->_regInfo)._signature & 0xf00) != 0) goto LAB_00132745;
          if (pVVar36->_state != '\x01') goto LAB_0013274a;
          bVar34 = pVVar36->_physId;
          if (bVar34 == 0xff) goto LAB_0013274f;
          if (bVar34 < 0x20) {
            pXVar49 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
            X86RAPass::emitSave(pXVar49,pVVar36,(uint)bVar34,"Save");
            pVVar36->_modified = '\0';
            pXVar2 = &(pXVar49->_x86State)._modified;
            (pXVar2->field_0).field_0._gp =
                 (pXVar2->field_0).field_0._gp &
                 ((ushort)(-2 << (bVar34 & 0x1f)) | (ushort)(0xfffffffe >> 0x20 - (bVar34 & 0x1f)));
            X86RAPass::_checkState(pXVar49);
            goto LAB_001316c2;
          }
          goto LAB_00132754;
        }
LAB_001316d8:
        pp_Var45 = (self->super_RAPass).super_CBPass._vptr_CBPass;
        uVar32 = (uint)(*(byte *)((long)pp_Var45 + 0x2a2) &
                       *(byte *)((long)&(self->super_RAPass)._zone[1]._end + 2) &
                       *(byte *)((long)pp_Var45 + 0x29a));
        if (uVar32 != 0) {
          pp_Var45 = pp_Var45 + 0x3b;
          while ((uVar32 & 1) == 0) {
LAB_001317b5:
            pp_Var45 = pp_Var45 + 1;
            bVar25 = uVar32 < 2;
            uVar32 = uVar32 >> 1;
            if (bVar25) goto LAB_001317c8;
          }
          pVVar36 = (VirtReg *)*pp_Var45;
          if (pVVar36 == (VirtReg *)0x0) goto LAB_001326e1;
          if (pVVar36->_modified == '\0') goto LAB_001326e6;
          if ((pVVar36->_tied != (TiedReg *)0x0) && ((pVVar36->_tied->flags & 0x1002) != 0))
          goto LAB_001317b5;
          if (((pVVar36->_regInfo)._signature & 0xf00) != 0x200) goto LAB_00132759;
          if (pVVar36->_state != '\x01') goto LAB_0013275e;
          bVar34 = pVVar36->_physId;
          if (bVar34 == 0xff) goto LAB_00132763;
          if (bVar34 < 0x20) {
            pXVar49 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
            X86RAPass::emitSave(pXVar49,pVVar36,(uint)bVar34,"Save");
            pVVar36->_modified = '\0';
            puVar3 = &(pXVar49->_x86State)._modified.field_0.field_0._mm;
            *puVar3 = *puVar3 & ~(byte)(1 << (bVar34 & 0x1f));
            X86RAPass::_checkState(pXVar49);
            goto LAB_001317b5;
          }
          goto LAB_00132768;
        }
LAB_001317c8:
        pp_Var45 = (self->super_RAPass).super_CBPass._vptr_CBPass;
        uVar32 = *(uint *)((long)pp_Var45 + 0x29c) &
                 *(uint *)((long)&(self->super_RAPass)._zone[1]._end + 4) &
                 *(uint *)((long)pp_Var45 + 0x2a4);
        if (uVar32 != 0) {
          pp_Var45 = pp_Var45 + 0x43;
          while ((uVar32 & 1) == 0) {
LAB_0013189d:
            pp_Var45 = pp_Var45 + 1;
            bVar25 = uVar32 < 2;
            uVar32 = uVar32 >> 1;
            if (bVar25) goto LAB_001318b3;
          }
          pVVar36 = (VirtReg *)*pp_Var45;
          if (pVVar36 == (VirtReg *)0x0) goto LAB_001326f0;
          if (pVVar36->_modified == '\0') goto LAB_001326f5;
          if ((pVVar36->_tied != (TiedReg *)0x0) && ((pVVar36->_tied->flags & 0x1002) != 0))
          goto LAB_0013189d;
          if (((pVVar36->_regInfo)._signature & 0xf00) != 0x100) goto LAB_0013276d;
          if (pVVar36->_state != '\x01') goto LAB_00132772;
          bVar34 = pVVar36->_physId;
          if (bVar34 == 0xff) goto LAB_00132777;
          if (bVar34 < 0x20) {
            pXVar49 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
            X86RAPass::emitSave(pXVar49,pVVar36,(uint)bVar34,"Save");
            pVVar36->_modified = '\0';
            puVar4 = &(pXVar49->_x86State)._modified.field_0.field_0._vec;
            *puVar4 = *puVar4 & (-2 << (bVar34 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar34 & 0x1f));
            X86RAPass::_checkState(pXVar49);
            goto LAB_0013189d;
          }
          goto LAB_0013277c;
        }
LAB_001318b3:
        pcVar48 = (self->super_RAPass).super_CBPass._name;
        bVar34 = pcVar48[0x90];
        if ((ulong)bVar34 != 0) {
          src = *(Imm **)(pcVar48 + 0x150);
          uVar30 = 0;
          while (((src->super_Operand).super_Operand_.field_0._any.signature & 7) != 3) {
LAB_0013194d:
            uVar30 = uVar30 + 1;
            src = src + 1;
            if (bVar34 == uVar30) goto LAB_0013195d;
          }
          if (uVar30 < 0x20) {
            uVar32 = *(uint *)(pcVar48 + uVar30 * 4 + 0xb0);
            if ((uVar32 >> 0x10 & 1) == 0) {
              pXVar49 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
              uVar38 = (pXVar49->_zsp).super_X86Reg.super_Reg.super_Operand.super_Operand_.field_0.
                       _any.signature;
              aStack_80._any.reserved8_4 = (uVar32 & 0xffff) - (uVar38 >> 0x18);
              aStack_80._packed[0] = (UInt64)((ulong)(uVar38 & 0xf8) | 2);
              aStack_80._any.reserved12_4 =
                   (pXVar49->_zsp).super_X86Reg.super_Reg.super_Operand.super_Operand_.field_0._any.
                   id;
              X86RAPass::emitImmToStack(pXVar49,uVar32 >> 0x18,(X86Mem *)&aStack_80._any,src);
            }
            else {
              X86RAPass::emitImmToReg
                        ((X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass,uVar32 >> 0x18,
                         uVar32 & 0xff,src);
            }
            goto LAB_0013194d;
          }
          goto LAB_001326eb;
        }
LAB_0013195d:
        uVar30 = (ulong)*(byte *)((long)(self->super_RAPass)._heap._slots + 0x1c);
        if (uVar30 != 0) {
          pZVar12 = (self->super_RAPass)._heap._zone;
          uVar46 = 0;
          while (((ulong)(&pZVar12->_end)[uVar46 * 3] & 1) == 0) {
LAB_00131a27:
            uVar46 = uVar46 + 1;
            if (uVar46 == uVar30) goto LAB_00131a35;
          }
          ppuVar6 = &pZVar12->_ptr + uVar46 * 3;
          uVar32 = *(uint *)(ppuVar6 + 2);
          if (uVar32 == 0) goto LAB_00131a27;
          pVVar36 = (VirtReg *)*ppuVar6;
          bVar34 = pVVar36->_physId;
          if (bVar34 == 0xff) goto LAB_00132781;
          if (bVar34 < 0x20) {
            uVar32 = uVar32 & (-2 << (bVar34 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar34 & 0x1f));
            if (uVar32 != 0) {
              uVar50 = 0;
              do {
                if ((uVar32 & 1) != 0) {
                  X86RAPass::emitMove((X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass,
                                      pVVar36,uVar50,(uint)bVar34,"Duplicate");
                  if (0x1f < uVar50) goto LAB_00132597;
                  pp_Var45 = (self->super_RAPass).super_CBPass._vptr_CBPass + 0x56;
                  *(ushort *)pp_Var45 = *(ushort *)pp_Var45 | (ushort)(1 << ((byte)uVar50 & 0x1f));
                }
                uVar50 = uVar50 + 1;
                bVar25 = 1 < uVar32;
                uVar32 = uVar32 >> 1;
              } while (bVar25);
            }
            goto LAB_00131a27;
          }
          goto LAB_00132786;
        }
LAB_00131a35:
        uVar30 = (ulong)*(byte *)((long)(self->super_RAPass)._heap._slots + 0x1e);
        if (uVar30 != 0) {
          pSVar14 = (self->super_RAPass)._heap._slots[1];
          uVar46 = 0;
          while (((ulong)pSVar14[uVar46 * 3 + 1].next & 1) == 0) {
LAB_00131afe:
            uVar46 = uVar46 + 1;
            if (uVar46 == uVar30) goto LAB_00131b0c;
          }
          pSVar7 = pSVar14 + uVar46 * 3;
          uVar32 = *(uint *)&pSVar7[2].next;
          if (uVar32 == 0) goto LAB_00131afe;
          pVVar36 = (VirtReg *)pSVar7->next;
          bVar34 = pVVar36->_physId;
          if (bVar34 == 0xff) goto LAB_0013278b;
          if (bVar34 < 0x20) {
            uVar32 = uVar32 & (-2 << (bVar34 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar34 & 0x1f));
            if (uVar32 != 0) {
              uVar50 = 0;
              do {
                if ((uVar32 & 1) != 0) {
                  X86RAPass::emitMove((X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass,
                                      pVVar36,uVar50,(uint)bVar34,"Duplicate");
                  if (0x1f < uVar50) goto LAB_0013259c;
                  pbVar5 = (byte *)((long)(self->super_RAPass).super_CBPass._vptr_CBPass + 0x2b2);
                  *pbVar5 = *pbVar5 | (byte)(1 << ((byte)uVar50 & 0x1f));
                }
                uVar50 = uVar50 + 1;
                bVar25 = 1 < uVar32;
                uVar32 = uVar32 >> 1;
              } while (bVar25);
            }
            goto LAB_00131afe;
          }
          goto LAB_00132790;
        }
LAB_00131b0c:
        uVar30 = (ulong)*(byte *)((long)(self->super_RAPass)._heap._slots + 0x1d);
        if (uVar30 != 0) {
          pSVar14 = (self->super_RAPass)._heap._slots[0];
          uVar46 = 0;
          while (((ulong)pSVar14[uVar46 * 3 + 1].next & 1) == 0) {
LAB_00131bd5:
            uVar46 = uVar46 + 1;
            if (uVar46 == uVar30) goto LAB_00131be3;
          }
          pSVar7 = pSVar14 + uVar46 * 3;
          uVar32 = *(uint *)&pSVar7[2].next;
          if (uVar32 == 0) goto LAB_00131bd5;
          pVVar36 = (VirtReg *)pSVar7->next;
          bVar34 = pVVar36->_physId;
          if (bVar34 == 0xff) goto LAB_00132795;
          if (bVar34 < 0x20) {
            uVar32 = uVar32 & (-2 << (bVar34 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar34 & 0x1f));
            if (uVar32 != 0) {
              uVar50 = 0;
              do {
                if ((uVar32 & 1) != 0) {
                  X86RAPass::emitMove((X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass,
                                      pVVar36,uVar50,(uint)bVar34,"Duplicate");
                  if (0x1f < uVar50) goto LAB_001325a1;
                  puVar39 = (uint *)((long)(self->super_RAPass).super_CBPass._vptr_CBPass + 0x2b4);
                  *puVar39 = *puVar39 | 1 << ((byte)uVar50 & 0x1f);
                }
                uVar50 = uVar50 + 1;
                bVar25 = 1 < uVar32;
                uVar32 = uVar32 >> 1;
              } while (bVar25);
            }
            goto LAB_00131bd5;
          }
          goto LAB_0013279a;
        }
LAB_00131be3:
        pVVar36 = pVStack_70;
        X86RAPass_translateOperands
                  ((X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass,
                   (Operand_ *)pVStack_70[1]._name,(uint)*(byte *)((long)&pVStack_70->_size + 1));
        pCVar10 = (self->super_RAPass).super_CBPass._cb;
        pCVar10->_cursor = (CBNode *)pVVar36;
        if (((pVVar36[1]._size & 0x1000000) != 0) &&
           (iVar42 = *(int *)((long)&pVVar36[2]._tied + 4), iVar42 != 0)) {
          CodeEmitter::emit(&pCVar10->super_CodeEmitter,0x2c4,
                            (Operand_ *)((self->super_RAPass).super_CBPass._vptr_CBPass + 0x27),
                            iVar42);
        }
        pp_Var45 = (self->super_RAPass).super_CBPass._vptr_CBPass;
        uVar32 = (uint)(*(ushort *)(pp_Var45 + 0x53) &
                       *(ushort *)&(self->super_RAPass)._zone[1]._end);
        if (uVar32 != 0) {
          pp_Var45 = pp_Var45 + 0x2b;
          while ((uVar32 & 1) == 0) {
LAB_00131ced:
            pp_Var45 = pp_Var45 + 1;
            bVar25 = uVar32 < 2;
            uVar32 = uVar32 >> 1;
            if (bVar25) goto LAB_00131d00;
          }
          p_Var16 = *pp_Var45;
          if (p_Var16 == (_func_int *)0x0) goto LAB_001326fa;
          if ((p_Var16[0x26] == (_func_int)0x0) ||
             ((*(long *)(p_Var16 + 0x30) != 0 &&
              ((*(ushort *)(*(long *)(p_Var16 + 0x30) + 8) & 0x122a) != 0)))) {
            cVar26 = (code)0x2;
          }
          else {
            cVar26 = (code)0x0;
          }
          if (((byte)p_Var16[5] & 0xf) != 0) goto LAB_001326ff;
          pXVar49 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
          cVar8 = p_Var16[0x25];
          if ((byte)cVar8 == 0xff) {
            p_Var16[0x24] = cVar26;
LAB_00131ce1:
            X86RAPass::_checkState(pXVar49);
            goto LAB_00131ced;
          }
          if ((byte)cVar8 < 0x20) {
            p_Var16[0x24] = cVar26;
            *(undefined2 *)(p_Var16 + 0x25) = 0xff;
            uVar21 = (ushort)(-2 << ((byte)cVar8 & 0x1f)) |
                     (ushort)(0xfffffffe >> 0x20 - ((byte)cVar8 & 0x1f));
            (pXVar49->_x86State).field_0._list[(uint)(byte)cVar8] = (VirtReg *)0x0;
            pXVar2 = &(pXVar49->_x86State)._occupied;
            (pXVar2->field_0).field_0._gp = (pXVar2->field_0).field_0._gp & uVar21;
            pXVar2 = &(pXVar49->_x86State)._modified;
            (pXVar2->field_0).field_0._gp = (pXVar2->field_0).field_0._gp & uVar21;
            X86RAPass::_checkState(pXVar49);
            goto LAB_00131ce1;
          }
          goto LAB_0013279f;
        }
LAB_00131d00:
        pp_Var45 = (self->super_RAPass).super_CBPass._vptr_CBPass;
        uVar32 = (uint)(*(byte *)((long)pp_Var45 + 0x29a) &
                       *(byte *)((long)&(self->super_RAPass)._zone[1]._end + 2));
        if (uVar32 != 0) {
          pp_Var45 = pp_Var45 + 0x3b;
          while ((uVar32 & 1) == 0) {
LAB_00131dd1:
            pp_Var45 = pp_Var45 + 1;
            bVar25 = uVar32 < 2;
            uVar32 = uVar32 >> 1;
            if (bVar25) goto LAB_00131de4;
          }
          p_Var16 = *pp_Var45;
          if (p_Var16 == (_func_int *)0x0) goto LAB_00132704;
          if ((p_Var16[0x26] == (_func_int)0x0) ||
             ((*(long *)(p_Var16 + 0x30) != 0 &&
              ((*(ushort *)(*(long *)(p_Var16 + 0x30) + 8) & 0x122a) != 0)))) {
            cVar26 = (code)0x2;
          }
          else {
            cVar26 = (code)0x0;
          }
          if ((*(uint *)(p_Var16 + 4) & 0xf00) != 0x200) goto LAB_00132709;
          pXVar49 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
          cVar8 = p_Var16[0x25];
          if ((byte)cVar8 == 0xff) {
            p_Var16[0x24] = cVar26;
LAB_00131dc5:
            X86RAPass::_checkState(pXVar49);
            goto LAB_00131dd1;
          }
          if ((byte)cVar8 < 0x20) {
            p_Var16[0x24] = cVar26;
            *(undefined2 *)(p_Var16 + 0x25) = 0xff;
            *(undefined8 *)
             ((long)&(pXVar49->_x86State).field_0 + (ulong)(uint)(byte)cVar8 * 8 + 0x80) = 0;
            bVar34 = ~(byte)(1 << ((byte)cVar8 & 0x1f));
            puVar3 = &(pXVar49->_x86State)._occupied.field_0.field_0._mm;
            *puVar3 = *puVar3 & bVar34;
            puVar3 = &(pXVar49->_x86State)._modified.field_0.field_0._mm;
            *puVar3 = *puVar3 & bVar34;
            X86RAPass::_checkState(pXVar49);
            goto LAB_00131dc5;
          }
          goto LAB_001327a4;
        }
LAB_00131de4:
        pXVar49 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
        uVar32 = (pXVar49->_x86State)._occupied.field_0.field_0._vec &
                 *(uint *)((long)&(self->super_RAPass)._zone[1]._end + 4);
        if (uVar32 != 0) {
          pXVar49 = (X86RAPass *)((long)&(pXVar49->_x86State).field_0 + 0xc0);
          while ((uVar32 & 1) == 0) {
LAB_00131eac:
            pXVar49 = (X86RAPass *)((long)pXVar49 + 8);
            bVar25 = uVar32 < 2;
            uVar32 = uVar32 >> 1;
            if (bVar25) goto LAB_00131ebf;
          }
          lVar33 = *(long *)pXVar49;
          if (lVar33 == 0) goto LAB_0013270e;
          if ((*(char *)(lVar33 + 0x26) == '\0') ||
             ((*(long *)(lVar33 + 0x30) != 0 &&
              ((*(ushort *)(*(long *)(lVar33 + 0x30) + 8) & 0x122a) != 0)))) {
            uVar27 = 2;
          }
          else {
            uVar27 = 0;
          }
          if ((*(uint *)(lVar33 + 4) & 0xf00) != 0x100) goto LAB_00132713;
          pXVar37 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
          bVar34 = *(byte *)(lVar33 + 0x25);
          if (bVar34 == 0xff) {
            *(undefined1 *)(lVar33 + 0x24) = uVar27;
LAB_00131ea0:
            X86RAPass::_checkState(pXVar37);
            goto LAB_00131eac;
          }
          if (bVar34 < 0x20) {
            *(undefined1 *)(lVar33 + 0x24) = uVar27;
            *(undefined2 *)(lVar33 + 0x25) = 0xff;
            uVar38 = -2 << (bVar34 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar34 & 0x1f);
            *(undefined8 *)((long)&(pXVar37->_x86State).field_0 + (ulong)(uint)bVar34 * 8 + 0xc0) =
                 0;
            puVar4 = &(pXVar37->_x86State)._occupied.field_0.field_0._vec;
            *puVar4 = *puVar4 & uVar38;
            puVar4 = &(pXVar37->_x86State)._modified.field_0.field_0._vec;
            *puVar4 = *puVar4 & uVar38;
            X86RAPass::_checkState(pXVar37);
            goto LAB_00131ea0;
          }
          goto LAB_001327a9;
        }
LAB_00131ebf:
        pVVar36 = (VirtReg *)(self->super_RAPass).super_CBPass._name;
        lVar33 = 0;
        while (((uVar32 = *(uint *)((long)&pVVar36[3]._id + lVar33), (uVar32 >> 0x10 & 1) == 0 ||
                (((&pVVar36[5]._raId)[lVar33] & 7) != 1)) ||
               ((uint)(&pVVar36[5]._memOffset)[lVar33] < 0x100))) {
LAB_0013231e:
          lVar33 = lVar33 + 4;
          if (lVar33 != 4) {
            bVar34 = *(byte *)((long)(self->super_RAPass)._heap._slots + 0x1c);
            if (bVar34 != 0) {
              pZVar12 = (self->super_RAPass)._heap._zone;
              lVar33 = 0;
              while ((*(byte *)((long)&pZVar12->_end + lVar33 + 1) & 0x10) == 0) {
LAB_001323bc:
                lVar33 = lVar33 + 0x18;
                if ((ulong)bVar34 * 0x18 == lVar33) goto LAB_001323c5;
              }
              lVar44 = *(long *)((long)&pZVar12->_ptr + lVar33);
              if ((*(byte *)(lVar44 + 5) & 0xf) != 0) goto LAB_00132718;
              pXVar49 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
              bVar19 = *(byte *)(lVar44 + 0x25);
              if (bVar19 == 0xff) {
                *(undefined1 *)(lVar44 + 0x24) = 0;
LAB_001323b0:
                X86RAPass::_checkState(pXVar49);
                goto LAB_001323bc;
              }
              if (bVar19 < 0x20) {
                *(undefined2 *)(lVar44 + 0x24) = 0xff00;
                *(undefined1 *)(lVar44 + 0x26) = 0;
                uVar21 = (ushort)(-2 << (bVar19 & 0x1f)) |
                         (ushort)(0xfffffffe >> 0x20 - (bVar19 & 0x1f));
                (pXVar49->_x86State).field_0._list[(uint)bVar19] = (VirtReg *)0x0;
                pXVar2 = &(pXVar49->_x86State)._occupied;
                (pXVar2->field_0).field_0._gp = (pXVar2->field_0).field_0._gp & uVar21;
                pXVar2 = &(pXVar49->_x86State)._modified;
                (pXVar2->field_0).field_0._gp = (pXVar2->field_0).field_0._gp & uVar21;
                X86RAPass::_checkState(pXVar49);
                goto LAB_001323b0;
              }
              goto LAB_001327ae;
            }
LAB_001323c5:
            bVar34 = *(byte *)((long)(self->super_RAPass)._heap._slots + 0x1e);
            if (bVar34 != 0) {
              pSVar14 = (self->super_RAPass)._heap._slots[1];
              lVar33 = 0;
              while ((*(byte *)((long)&pSVar14[1].next + lVar33 + 1) & 0x10) == 0) {
LAB_00132461:
                lVar33 = lVar33 + 0x18;
                if ((ulong)bVar34 * 0x18 == lVar33) goto LAB_0013246e;
              }
              lVar44 = *(long *)((long)&pSVar14->next + lVar33);
              if ((*(uint *)(lVar44 + 4) & 0xf00) != 0x200) goto LAB_0013271d;
              pXVar49 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
              bVar19 = *(byte *)(lVar44 + 0x25);
              if (bVar19 == 0xff) {
                *(undefined1 *)(lVar44 + 0x24) = 0;
LAB_00132455:
                X86RAPass::_checkState(pXVar49);
                goto LAB_00132461;
              }
              if (bVar19 < 0x20) {
                *(undefined2 *)(lVar44 + 0x24) = 0xff00;
                *(undefined1 *)(lVar44 + 0x26) = 0;
                *(undefined8 *)
                 ((long)&(pXVar49->_x86State).field_0 + (ulong)(uint)bVar19 * 8 + 0x80) = 0;
                bVar19 = ~(byte)(1 << (bVar19 & 0x1f));
                puVar3 = &(pXVar49->_x86State)._occupied.field_0.field_0._mm;
                *puVar3 = *puVar3 & bVar19;
                puVar3 = &(pXVar49->_x86State)._modified.field_0.field_0._mm;
                *puVar3 = *puVar3 & bVar19;
                X86RAPass::_checkState(pXVar49);
                goto LAB_00132455;
              }
              goto LAB_001327b3;
            }
LAB_0013246e:
            bVar34 = *(byte *)((long)(self->super_RAPass)._heap._slots + 0x1d);
            if (bVar34 == 0) goto LAB_00132515;
            pSVar14 = (self->super_RAPass)._heap._slots[0];
            lVar33 = 0;
            while ((*(byte *)((long)&pSVar14[1].next + lVar33 + 1) & 0x10) == 0) {
LAB_00132508:
              lVar33 = lVar33 + 0x18;
              if ((ulong)bVar34 * 0x18 == lVar33) {
LAB_00132515:
                uVar30 = (ulong)*(uint *)((self->super_RAPass)._heap._slots + 3);
                if (uVar30 != 0) {
                  lVar33 = 0;
                  do {
                    *(undefined8 *)
                     (*(long *)((long)&((self->super_RAPass)._heap._zone)->_ptr + lVar33) + 0x30) =
                         0;
                    lVar33 = lVar33 + 0x18;
                  } while (uVar30 * 0x18 != lVar33);
                }
                return 0;
              }
            }
            lVar44 = *(long *)((long)&pSVar14->next + lVar33);
            if ((*(uint *)(lVar44 + 4) & 0xf00) != 0x100) goto LAB_00132727;
            pXVar49 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
            bVar19 = *(byte *)(lVar44 + 0x25);
            if (bVar19 == 0xff) {
              *(undefined1 *)(lVar44 + 0x24) = 0;
LAB_001324fc:
              X86RAPass::_checkState(pXVar49);
              goto LAB_00132508;
            }
            if (bVar19 < 0x20) {
              *(undefined2 *)(lVar44 + 0x24) = 0xff00;
              *(undefined1 *)(lVar44 + 0x26) = 0;
              uVar32 = -2 << (bVar19 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar19 & 0x1f);
              *(undefined8 *)((long)&(pXVar49->_x86State).field_0 + (ulong)(uint)bVar19 * 8 + 0xc0)
                   = 0;
              puVar4 = &(pXVar49->_x86State)._occupied.field_0.field_0._vec;
              *puVar4 = *puVar4 & uVar32;
              puVar4 = &(pXVar49->_x86State)._modified.field_0.field_0._vec;
              *puVar4 = *puVar4 & uVar32;
              X86RAPass::_checkState(pXVar49);
              goto LAB_001324fc;
            }
            goto LAB_001327b8;
          }
        }
        if ((&pVVar36[5]._memOffset)[lVar33] == -1) goto LAB_001327bd;
        pCVar10 = (self->super_RAPass).super_CBPass._cb;
        uVar30 = (ulong)((&pVVar36[5]._memOffset)[lVar33] - 0x100);
        uVar17._0_4_ = pCVar10[1].super_CodeEmitter._privateData;
        uVar17._4_4_ = pCVar10[1].super_CodeEmitter._globalHints;
        if (uVar17 <= uVar30) goto LAB_001327c2;
        pVVar51 = *(VirtReg **)(*(long *)&pCVar10[1].super_CodeEmitter._type + uVar30 * 8);
        uVar43 = uVar32 & 0xff;
        uVar38 = (pVVar51->_regInfo)._signature >> 8 & 0xf;
        bVar34 = (byte)uVar32;
        if (uVar38 != 2) {
          if (uVar38 == 1) {
            uVar32 = uVar32 >> 8 & 0xff;
            if (uVar32 < 0x20) {
              if ((*(uint *)(x86OpData + (ulong)uVar32 * 4) & 0xf00) != 0x100) {
                if ((long)(char)pVVar51->_typeId < 0) goto LAB_0013281f;
                cVar18 = TypeId::_info[(long)(char)pVVar51->_typeId + 0x80];
                this = (RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
                if (pVVar51->_memCell == (RACell *)0x0) {
                  RAPass::_newVarCell(this,pVVar51);
                }
                uVar32 = (uint)(cVar18 != '*') * 0x4000000 + 0x4000000;
                pXVar49 = (X86RAPass *)(ulong)uVar32;
                aStack_80._any.reserved12_4 = pVVar51->_id;
                aStack_80._any.reserved8_4 = 0;
                aStack_80._any.id = 0xffffffff;
                aStack_80._any.signature =
                     (((this->super_CBPass)._cb)->super_CodeEmitter)._nativeGpReg.super_Operand.
                     super_Operand_.field_0._any.signature & 0xf8 | 0x8002 | uVar32;
                if (((pVVar51->_regInfo)._signature & 0xf00) == 0x100) {
                  pXVar37 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
                  bVar34 = pVVar51->_physId;
                  if (bVar34 == 0xff) {
                    pVVar51->_state = '\x02';
                  }
                  else {
                    if (0x1f < bVar34) goto LAB_00132842;
                    pVVar51->_state = '\x02';
                    pVVar51->_physId = 0xff;
                    pVVar51->_modified = '\0';
                    uVar32 = -2 << (bVar34 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar34 & 0x1f);
                    *(undefined8 *)
                     ((long)&(pXVar37->_x86State).field_0 + (ulong)(uint)bVar34 * 8 + 0xc0) = 0;
                    puVar4 = &(pXVar37->_x86State)._occupied.field_0.field_0._vec;
                    *puVar4 = *puVar4 & uVar32;
                    puVar4 = &(pXVar37->_x86State)._modified.field_0.field_0._vec;
                    *puVar4 = *puVar4 & uVar32;
                    X86RAPass::_checkState(pXVar37);
                  }
                  X86RAPass::_checkState(pXVar37);
                  CodeEmitter::emit(&((self->super_RAPass).super_CBPass._cb)->super_CodeEmitter,0xe7
                                    ,(Operand_ *)&aStack_80._any);
                  goto LAB_0013231e;
                }
                goto LAB_00132829;
              }
              pXVar49 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
              bVar19 = pVVar51->_physId;
              if (bVar19 == 0xff) {
                pVVar51->_state = '\0';
LAB_0013227d:
                X86RAPass::_checkState(pXVar49);
                if (((pVVar51->_regInfo)._signature & 0xf00) != 0x100) goto LAB_0013282e;
                if (uVar43 == 0xff) goto LAB_00132833;
                if (uVar43 < 0x20) {
                  uVar32 = 1 << (bVar34 & 0x1f);
                  pXVar37 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
                  pVVar51->_state = '\x01';
                  pVVar51->_modified = '\x01';
                  pVVar51->_physId = bVar34;
                  pVVar51->_homeMask = pVVar51->_homeMask | uVar32;
                  *(VirtReg **)((long)&(pXVar37->_x86State).field_0 + (ulong)uVar43 * 8 + 0xc0) =
                       pVVar51;
                  puVar4 = &(pXVar37->_x86State)._occupied.field_0.field_0._vec;
                  *puVar4 = *puVar4 | uVar32;
                  puVar4 = &(pXVar37->_x86State)._modified.field_0.field_0._vec;
                  *puVar4 = *puVar4 | uVar32;
                  goto LAB_001322ec;
                }
                goto LAB_00132838;
              }
              if (bVar19 < 0x20) {
                pVVar51->_state = '\0';
                pVVar51->_physId = 0xff;
                pVVar51->_modified = '\0';
                uVar32 = -2 << (bVar19 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar19 & 0x1f);
                *(undefined8 *)
                 ((long)&(pXVar49->_x86State).field_0 + (ulong)(uint)bVar19 * 8 + 0xc0) = 0;
                puVar4 = &(pXVar49->_x86State)._occupied.field_0.field_0._vec;
                *puVar4 = *puVar4 & uVar32;
                puVar4 = &(pXVar49->_x86State)._modified.field_0.field_0._vec;
                *puVar4 = *puVar4 & uVar32;
                X86RAPass::_checkState(pXVar49);
                goto LAB_0013227d;
              }
              goto LAB_0013283d;
            }
            goto LAB_001327c7;
          }
          if (uVar38 != 0) goto LAB_0013231e;
          pXVar49 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
          bVar19 = pVVar51->_physId;
          if (bVar19 != 0xff) {
            if (bVar19 < 0x20) {
              pVVar51->_state = '\0';
              pVVar51->_physId = 0xff;
              pVVar51->_modified = '\0';
              uVar21 = (ushort)(-2 << (bVar19 & 0x1f)) |
                       (ushort)(0xfffffffe >> 0x20 - (bVar19 & 0x1f));
              (pXVar49->_x86State).field_0._list[(uint)bVar19] = (VirtReg *)0x0;
              pXVar2 = &(pXVar49->_x86State)._occupied;
              (pXVar2->field_0).field_0._gp = (pXVar2->field_0).field_0._gp & uVar21;
              pXVar2 = &(pXVar49->_x86State)._modified;
              (pXVar2->field_0).field_0._gp = (pXVar2->field_0).field_0._gp & uVar21;
              X86RAPass::_checkState(pXVar49);
              goto LAB_00132200;
            }
LAB_00132815:
            X86CallAlloc::run();
            goto LAB_0013281a;
          }
          pVVar51->_state = '\0';
LAB_00132200:
          X86RAPass::_checkState(pXVar49);
          if (((pVVar51->_regInfo)._signature & 0xf00) == 0) {
            if (bVar34 == 0xff) goto LAB_001327db;
            if ((uVar32 & 0xff) == 4) {
              DebugUtils::assertionFailed
                        ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/x86/../x86/x86regalloc_p.h"
                         ,0x164,"C != X86Reg::kKindGp || physId != X86Gp::kIdSp");
            }
            if (uVar43 < 0x20) {
              uVar32 = 1 << (bVar34 & 0x1f);
              pXVar49 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
              pVVar51->_state = '\x01';
              pVVar51->_modified = '\x01';
              pVVar51->_physId = bVar34;
              pVVar51->_homeMask = pVVar51->_homeMask | uVar32;
              (pXVar49->_x86State).field_0._list[uVar43] = pVVar51;
              pXVar2 = &(pXVar49->_x86State)._occupied;
              uVar21 = (ushort)uVar32;
              (pXVar2->field_0).field_0._gp = (pXVar2->field_0).field_0._gp | uVar21;
              pXVar2 = &(pXVar49->_x86State)._modified;
              (pXVar2->field_0).field_0._gp = (pXVar2->field_0).field_0._gp | uVar21;
              X86RAPass::_checkState(pXVar49);
              pXVar49 = self;
              goto LAB_0013231e;
            }
            goto LAB_00132810;
          }
          goto LAB_001327cc;
        }
        pXVar49 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
        bVar19 = pVVar51->_physId;
        if (bVar19 != 0xff) {
          if (bVar19 < 0x20) {
            pVVar51->_state = '\0';
            pVVar51->_physId = 0xff;
            pVVar51->_modified = '\0';
            *(undefined8 *)((long)&(pXVar49->_x86State).field_0 + (ulong)(uint)bVar19 * 8 + 0x80) =
                 0;
            bVar19 = ~(byte)(1 << (bVar19 & 0x1f));
            puVar3 = &(pXVar49->_x86State)._occupied.field_0.field_0._mm;
            *puVar3 = *puVar3 & bVar19;
            puVar3 = &(pXVar49->_x86State)._modified.field_0.field_0._mm;
            *puVar3 = *puVar3 & bVar19;
            X86RAPass::_checkState(pXVar49);
            goto LAB_00132187;
          }
LAB_0013281a:
          X86CallAlloc::run();
LAB_0013281f:
          X86CallAlloc::run();
          X86CallAlloc::run();
LAB_00132829:
          X86CallAlloc::run();
LAB_0013282e:
          X86CallAlloc::run();
LAB_00132833:
          X86CallAlloc::run();
LAB_00132838:
          X86CallAlloc::run();
LAB_0013283d:
          X86CallAlloc::run();
LAB_00132842:
          X86CallAlloc::run();
          uVar50 = extraout_EDX;
LAB_00132847:
          X86RAPass::emitMove(pXVar49,pVVar36,uVar50,(uint32_t)pVVar51,"Alloc");
          *(undefined8 *)
           ((long)&(pXVar49->_x86State).field_0 + ((ulong)pVVar51 & 0xffffffff) * 8 + 0x80) = 0;
LAB_001328b7:
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/x86/../base/../base/../base/../base/utils.h"
                     ,0x13e,"x < 32");
        }
        pVVar51->_state = '\0';
LAB_00132187:
        X86RAPass::_checkState(pXVar49);
        if (((pVVar51->_regInfo)._signature & 0xf00) != 0x200) goto LAB_001327d1;
        if (uVar43 != 0xff) {
          if (0x1f < uVar43) {
            X86CallAlloc::run();
LAB_00132810:
            X86CallAlloc::run();
            goto LAB_00132815;
          }
          uVar32 = 1 << (bVar34 & 0x1f);
          pXVar37 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
          pVVar51->_state = '\x01';
          pVVar51->_modified = '\x01';
          pVVar51->_physId = bVar34;
          pVVar51->_homeMask = pVVar51->_homeMask | uVar32;
          *(VirtReg **)((long)&(pXVar37->_x86State).field_0 + (ulong)uVar43 * 8 + 0x80) = pVVar51;
          puVar3 = &(pXVar37->_x86State)._occupied.field_0.field_0._mm;
          bVar34 = (byte)uVar32;
          *puVar3 = *puVar3 | bVar34;
          puVar3 = &(pXVar37->_x86State)._modified.field_0.field_0._mm;
          *puVar3 = *puVar3 | bVar34;
LAB_001322ec:
          X86RAPass::_checkState(pXVar37);
          goto LAB_0013231e;
        }
        goto LAB_001327d6;
      }
      if (((uVar32 & 7) == 1) && (0xff < *(uint *)((long)&opArray->field_0 + lVar33 + 4))) {
        iVar42 = *(int *)((long)&opArray->field_0 + lVar33 + 4);
        if (iVar42 == -1) {
          pcStack_40 = (code *)0x1303f0;
          X86RAPass_translateOperands();
LAB_001303f0:
          pcStack_40 = (code *)0x1303f5;
          X86RAPass_translateOperands();
LAB_001303f5:
          pcStack_40 = (code *)0x1303fa;
          X86RAPass_translateOperands();
LAB_001303fa:
          pcStack_40 = (code *)0x1303ff;
          X86RAPass_translateOperands();
LAB_001303ff:
          pcStack_40 = (code *)0x130404;
          X86RAPass_translateOperands();
LAB_00130404:
          pcStack_40 = (code *)0x130409;
          X86RAPass_translateOperands();
          goto LAB_00130409;
        }
        uVar30 = (ulong)(iVar42 - 0x100);
        uVar11._0_4_ = pCVar10[1].super_CodeEmitter._privateData;
        uVar11._4_4_ = pCVar10[1].super_CodeEmitter._globalHints;
        if (uVar11 <= uVar30) goto LAB_001303f0;
        lVar29 = *(long *)(*(long *)&pCVar10[1].super_CodeEmitter._type + uVar30 * 8);
        if (lVar29 == 0) goto LAB_001303f5;
        bVar34 = *(byte *)(lVar29 + 0x25);
        if (bVar34 == 0xff) goto LAB_001303fa;
        in_RAX = &opArray[lVar47].field_0._signature + 1;
LAB_001303c7:
        *in_RAX = (uint)bVar34;
      }
LAB_001303cc:
      lVar47 = lVar47 + 1;
      lVar33 = lVar33 + 0x10;
    } while (lVar44 != lVar33);
  }
  return (Error)in_RAX;
LAB_00132556:
  X86CallAlloc::run();
LAB_0013255b:
  X86CallAlloc::run();
LAB_00132560:
  X86CallAlloc::run();
LAB_00132565:
  X86CallAlloc::run();
LAB_0013256a:
  X86CallAlloc::run();
LAB_0013256f:
  X86CallAlloc::run();
LAB_00132574:
  X86CallAlloc::run();
LAB_00132579:
  X86CallAlloc::run();
LAB_0013257e:
  X86CallAlloc::run();
LAB_00132583:
  X86CallAlloc::run();
LAB_00132588:
  X86CallAlloc::run();
LAB_0013258d:
  X86CallAlloc::run();
LAB_00132592:
  X86CallAlloc::run();
LAB_00132597:
  X86CallAlloc::run();
LAB_0013259c:
  X86CallAlloc::run();
LAB_001325a1:
  X86CallAlloc::run();
LAB_001325a6:
  X86CallAlloc::run();
LAB_001325ab:
  X86CallAlloc::run();
LAB_001325b0:
  X86CallAlloc::run();
LAB_001325b5:
  X86CallAlloc::run();
LAB_001325ba:
  X86CallAlloc::run();
LAB_001325bf:
  X86CallAlloc::run();
LAB_001325c4:
  X86CallAlloc::run();
LAB_001325c9:
  X86CallAlloc::run();
LAB_001325ce:
  X86CallAlloc::run();
LAB_001325d3:
  X86CallAlloc::run();
LAB_001325d8:
  X86CallAlloc::run();
LAB_001325dd:
  X86CallAlloc::run();
LAB_001325e2:
  X86CallAlloc::run();
LAB_001325e7:
  X86CallAlloc::run();
LAB_001325ec:
  X86CallAlloc::run();
LAB_001325f1:
  X86CallAlloc::run();
LAB_001325f6:
  X86CallAlloc::run();
LAB_001325fb:
  X86CallAlloc::run();
LAB_00132600:
  X86CallAlloc::run();
LAB_00132605:
  X86CallAlloc::run();
LAB_0013260a:
  X86CallAlloc::run();
LAB_0013260f:
  X86CallAlloc::run();
LAB_00132614:
  X86CallAlloc::run();
LAB_00132619:
  X86CallAlloc::run();
LAB_0013261e:
  X86CallAlloc::run();
LAB_00132623:
  X86CallAlloc::run();
LAB_00132628:
  X86CallAlloc::run();
LAB_0013262d:
  X86CallAlloc::run();
LAB_00132632:
  X86CallAlloc::run();
LAB_00132637:
  X86CallAlloc::run();
LAB_0013263c:
  X86CallAlloc::run();
LAB_00132641:
  X86CallAlloc::run();
LAB_00132646:
  X86CallAlloc::run();
LAB_0013264b:
  X86CallAlloc::run();
LAB_00132650:
  X86CallAlloc::run();
LAB_00132655:
  X86CallAlloc::run();
LAB_0013265a:
  X86CallAlloc::run();
LAB_0013265f:
  X86CallAlloc::run();
LAB_00132664:
  X86CallAlloc::run();
LAB_00132669:
  X86CallAlloc::run();
LAB_0013266e:
  X86CallAlloc::run();
LAB_00132673:
  X86CallAlloc::run();
LAB_00132678:
  X86CallAlloc::run();
LAB_0013267d:
  X86CallAlloc::run();
LAB_00132682:
  X86CallAlloc::run();
LAB_00132687:
  X86CallAlloc::run();
LAB_0013268c:
  X86CallAlloc::run();
LAB_00132691:
  X86CallAlloc::run();
LAB_00132696:
  X86CallAlloc::run();
LAB_0013269b:
  X86CallAlloc::run();
LAB_001326a0:
  X86CallAlloc::run();
LAB_001326a5:
  X86CallAlloc::run();
LAB_001326aa:
  X86CallAlloc::run();
LAB_001326af:
  X86CallAlloc::run();
LAB_001326b4:
  X86CallAlloc::run();
LAB_001326b9:
  X86CallAlloc::run();
LAB_001326be:
  X86CallAlloc::run();
LAB_001326c3:
  X86CallAlloc::run();
LAB_001326c8:
  X86CallAlloc::run();
LAB_001326cd:
  X86CallAlloc::run();
LAB_001326d2:
  X86CallAlloc::run();
LAB_001326d7:
  X86CallAlloc::run();
LAB_001326dc:
  X86CallAlloc::run();
LAB_001326e1:
  X86CallAlloc::run();
LAB_001326e6:
  X86CallAlloc::run();
LAB_001326eb:
  X86CallAlloc::run();
LAB_001326f0:
  X86CallAlloc::run();
LAB_001326f5:
  X86CallAlloc::run();
LAB_001326fa:
  X86CallAlloc::run();
LAB_001326ff:
  X86CallAlloc::run();
LAB_00132704:
  X86CallAlloc::run();
LAB_00132709:
  X86CallAlloc::run();
LAB_0013270e:
  X86CallAlloc::run();
LAB_00132713:
  X86CallAlloc::run();
LAB_00132718:
  X86CallAlloc::run();
LAB_0013271d:
  X86CallAlloc::run();
LAB_00132722:
  X86CallAlloc::run();
LAB_00132727:
  X86CallAlloc::run();
LAB_0013272c:
  X86CallAlloc::run();
LAB_00132731:
  X86CallAlloc::run();
LAB_00132736:
  X86CallAlloc::run();
LAB_0013273b:
  X86CallAlloc::run();
LAB_00132740:
  X86CallAlloc::run();
LAB_00132745:
  X86CallAlloc::run();
LAB_0013274a:
  X86CallAlloc::run();
LAB_0013274f:
  X86CallAlloc::run();
LAB_00132754:
  X86CallAlloc::run();
LAB_00132759:
  X86CallAlloc::run();
LAB_0013275e:
  X86CallAlloc::run();
LAB_00132763:
  X86CallAlloc::run();
LAB_00132768:
  X86CallAlloc::run();
LAB_0013276d:
  X86CallAlloc::run();
LAB_00132772:
  X86CallAlloc::run();
LAB_00132777:
  X86CallAlloc::run();
LAB_0013277c:
  X86CallAlloc::run();
LAB_00132781:
  X86CallAlloc::run();
LAB_00132786:
  X86CallAlloc::run();
LAB_0013278b:
  X86CallAlloc::run();
LAB_00132790:
  X86CallAlloc::run();
LAB_00132795:
  X86CallAlloc::run();
LAB_0013279a:
  X86CallAlloc::run();
LAB_0013279f:
  X86CallAlloc::run();
LAB_001327a4:
  X86CallAlloc::run();
LAB_001327a9:
  X86CallAlloc::run();
LAB_001327ae:
  X86CallAlloc::run();
LAB_001327b3:
  X86CallAlloc::run();
LAB_001327b8:
  X86CallAlloc::run();
LAB_001327bd:
  X86CallAlloc::run();
LAB_001327c2:
  X86CallAlloc::run();
LAB_001327c7:
  X86CallAlloc::run();
LAB_001327cc:
  X86CallAlloc::run();
LAB_001327d1:
  X86CallAlloc::run();
LAB_001327d6:
  X86CallAlloc::run();
LAB_001327db:
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/x86/../x86/x86regalloc_p.h"
             ,0x161,"physId != Globals::kInvalidRegId");
}

Assistant:

static Error X86RAPass_translateOperands(X86RAPass* self, Operand_* opArray, uint32_t opCount) {
  X86Compiler* cc = self->cc();

  // Translate variables into registers.
  for (uint32_t i = 0; i < opCount; i++) {
    Operand_* op = &opArray[i];
    if (op->isVirtReg()) {
      VirtReg* vreg = cc->getVirtRegById(op->getId());
      ASMJIT_ASSERT(vreg != nullptr);
      ASMJIT_ASSERT(vreg->getPhysId() != Globals::kInvalidRegId);
      op->_reg.id = vreg->getPhysId();
    }
    else if (op->isMem()) {
      X86Mem* m = static_cast<X86Mem*>(op);

      if (m->hasBaseReg() && cc->isVirtRegValid(m->getBaseId())) {
        VirtReg* vreg = cc->getVirtRegById(m->getBaseId());

        if (m->isRegHome()) {
          self->getVarCell(vreg);
        }
        else {
          ASMJIT_ASSERT(vreg->getPhysId() != Globals::kInvalidRegId);
          op->_mem.base = vreg->getPhysId();
        }
      }

      if (m->hasIndexReg() && cc->isVirtRegValid(m->getIndexId())) {
        VirtReg* vreg = cc->getVirtRegById(m->getIndexId());
        op->_mem.index = vreg->getPhysId();
      }
    }
  }

  return kErrorOk;
}